

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChConstraintThreeBBShaft.cpp
# Opt level: O3

void __thiscall
chrono::ChConstraintThreeBBShaft::MultiplyAndAdd
          (ChConstraintThreeBBShaft *this,double *result,ChVectorDynamic<double> *vect)

{
  undefined1 auVar1 [16];
  ChVariables *pCVar2;
  double *pdVar3;
  long lVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  
  pCVar2 = (this->super_ChConstraintThree).variables_a;
  if (pCVar2->disabled == false) {
    lVar4 = (long)pCVar2->offset;
    if ((lVar4 < 0) ||
       ((vect->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows + -6
        < lVar4)) goto LAB_007dad3f;
    pdVar3 = (vect->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
    ;
    *result = (this->Cq_a).super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
              m_data.array[0] * pdVar3[lVar4] +
              (this->Cq_a).super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
              m_data.array[2] * pdVar3[lVar4 + 2] +
              (this->Cq_a).super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
              m_data.array[4] * pdVar3[lVar4 + 4] +
              (this->Cq_a).super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
              m_data.array[1] * (pdVar3 + lVar4)[1] +
              (this->Cq_a).super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
              m_data.array[3] * (pdVar3 + lVar4 + 2)[1] +
              (this->Cq_a).super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
              m_data.array[5] * (pdVar3 + lVar4 + 4)[1] + *result;
  }
  pCVar2 = (this->super_ChConstraintThree).variables_b;
  if (pCVar2->disabled == false) {
    lVar4 = (long)pCVar2->offset;
    if ((lVar4 < 0) ||
       ((vect->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows + -6
        < lVar4)) {
LAB_007dad3f:
      __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                    ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                    "Eigen::Block<const Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = const Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                   );
    }
    pdVar3 = (vect->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
    ;
    *result = (this->Cq_b).super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
              m_data.array[0] * pdVar3[lVar4] +
              (this->Cq_b).super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
              m_data.array[2] * pdVar3[lVar4 + 2] +
              (this->Cq_b).super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
              m_data.array[4] * pdVar3[lVar4 + 4] +
              (this->Cq_b).super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
              m_data.array[1] * (pdVar3 + lVar4)[1] +
              (this->Cq_b).super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
              m_data.array[3] * (pdVar3 + lVar4 + 2)[1] +
              (this->Cq_b).super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
              m_data.array[5] * (pdVar3 + lVar4 + 4)[1] + *result;
  }
  pCVar2 = (this->super_ChConstraintThree).variables_c;
  if (pCVar2->disabled == false) {
    lVar4 = (long)pCVar2->offset;
    if ((lVar4 < 0) ||
       ((vect->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows <=
        lVar4)) {
      __assert_fail("index >= 0 && index < size()",
                    "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0xb5,
                    "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 0>::operator()(Index) const [Derived = Eigen::Matrix<double, -1, 1>, Level = 0]"
                   );
    }
    auVar6._8_8_ = 0;
    auVar6._0_8_ = (this->Cq_c).super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_1,_1,_1>_>.
                   m_storage.m_data.array[0];
    auVar5._8_8_ = 0;
    auVar5._0_8_ = (vect->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                   m_data[lVar4];
    auVar1._8_8_ = 0;
    auVar1._0_8_ = *result;
    auVar1 = vfmadd213sd_fma(auVar6,auVar5,auVar1);
    *result = auVar1._0_8_;
  }
  return;
}

Assistant:

void ChConstraintThreeBBShaft::MultiplyAndAdd(double& result, const ChVectorDynamic<double>& vect) const {
    if (variables_a->IsActive()) {
        result += Cq_a * vect.segment(variables_a->GetOffset(), 6);
    }

    if (variables_b->IsActive()) {
        result += Cq_b * vect.segment(variables_b->GetOffset(), 6);
    }

    if (variables_c->IsActive()) {
        result += vect(variables_c->GetOffset()) * Cq_c(0);
    }
}